

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

int __thiscall JetHead::File::open(File *this,char *__file,int __oflag,...)

{
  int iVar1;
  int *piVar2;
  uint local_28;
  int sys_flags;
  int flags_local;
  char *name_local;
  File *this_local;
  
  this->mOpenFlags = __oflag;
  if ((__oflag & 3U) == 3) {
    local_28 = 2;
  }
  else if ((__oflag & 1U) == 0) {
    local_28 = (uint)((__oflag & 2U) != 0);
  }
  else {
    local_28 = 0;
  }
  if ((__oflag & 2U) != 0) {
    if ((__oflag & 4U) == 0) {
      if ((__oflag & 8U) != 0) {
        local_28 = local_28 | 0x400;
      }
    }
    else {
      local_28 = local_28 | 0x200;
    }
  }
  if ((__oflag & 0x20U) != 0) {
    local_28 = local_28 | 0x4000;
  }
  if ((__oflag & 0x10U) == 0) {
    iVar1 = ::open(__file,local_28);
    this->mFd = iVar1;
  }
  else {
    iVar1 = ::open(__file,local_28 | 0x40,0x1b6);
    this->mFd = iVar1;
  }
  if (this->mFd == -1) {
    piVar2 = __errno_location();
    this_local._4_4_ = getErrorCode(*piVar2);
  }
  else {
    this_local._4_4_ = kNoError;
  }
  return this_local._4_4_;
}

Assistant:

JetHead::ErrCode File::open( const char *name, int flags )
{
	int sys_flags = 0;

	TRACE_BEGIN( LOG_LVL_INFO );

	LOG( "Flags %x", flags );

	mOpenFlags = flags;

	if ( ( flags & OF_RDWR ) == OF_RDWR )
		sys_flags |= O_RDWR;
	else if ( flags & OF_READ )
		sys_flags |= O_RDONLY;
	else if ( flags & OF_WRITE )
		sys_flags |= O_WRONLY;
	else
		sys_flags |= O_RDONLY;

	// trunc and append only effect write operations.  We'll ignore if not
	//  opening for write.  Since rumor has it some platforms will do strange
	//  things when you open read only with these flags.
	if ( flags & OF_WRITE )
	{
		// if both trunc and append are set, we'll trunc.
		if ( flags & OF_TRUNC )
			sys_flags |= O_TRUNC;
		else if ( flags & OF_APPEND )
			sys_flags |= O_APPEND;
	}

#ifndef PLATFORM_DARWIN
	// This is a Linux specific construct that we support on those systems.
	//  if O_DIRECT is not passed, all calling code should still work on the
	//  non-Linux platform.
	if ( flags & OF_ODIRECT )
		sys_flags |= O_DIRECT;
#endif

	LOG( "sys_flags %x", sys_flags );

	if ( flags & OF_CREATE )
	{
		LOG( "Create" );
		sys_flags |= O_CREAT;
		mFd = ::open( name, sys_flags, 0666 );
	}
	else
		mFd = ::open( name, sys_flags );

	if (mFd == -1)
	{
		return getErrorCode( errno );
	}

	return JetHead::kNoError;
}